

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

string * flatbuffers::StripPrefix
                   (string *__return_storage_ptr__,string *filepath,string *prefix_to_remove)

{
  char *__s1;
  int iVar1;
  
  __s1 = (filepath->_M_dataplus)._M_p;
  iVar1 = strncmp(__s1,(prefix_to_remove->_M_dataplus)._M_p,prefix_to_remove->_M_string_length);
  if (iVar1 == 0) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filepath);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,__s1,__s1 + filepath->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StripPrefix(const std::string &filepath,
                        const std::string &prefix_to_remove) {
  if (!strncmp(filepath.c_str(), prefix_to_remove.c_str(),
               prefix_to_remove.size())) {
    return filepath.substr(prefix_to_remove.size());
  }
  return filepath;
}